

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::fill(CImg<unsigned_int> *this,uint *val)

{
  uint *puVar1;
  uint uVar2;
  bool bVar3;
  uint *__s;
  
  bVar3 = is_empty(this);
  if (!bVar3) {
    uVar2 = *val;
    __s = this->_data;
    if (uVar2 == 0) {
      memset(__s,0,(ulong)this->_width * (ulong)this->_height *
                   (ulong)this->_spectrum * (ulong)this->_depth * 4);
    }
    else {
      puVar1 = __s + (ulong)this->_spectrum * (ulong)this->_depth *
                     (ulong)this->_height * (ulong)this->_width;
      for (; __s < puVar1; __s = __s + 1) {
        *__s = uVar2;
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& fill(const T& val) {
      if (is_empty()) return *this;
      if (val && sizeof(T)!=1) cimg_for(*this,ptrd,T) *ptrd = val;
      else std::memset(_data,(int)(ulongT)val,sizeof(T)*size()); // Double cast to allow val to be (void*)
      return *this;
    }